

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O2

void mmt_decode(mmt_decode_funcs *funcs,void *state)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  mmt_dup_syscall *pmVar4;
  mmt_ioctl_post_v2 *pmVar5;
  mmt_ioctl_post_v2 *pmVar6;
  _func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *p_Var7;
  void *pvVar8;
  mmt_mremap *pmVar9;
  mmt_mmap *pmVar10;
  mmt_unmap *pmVar11;
  mmt_mmap2 *pmVar12;
  mmt_open *pmVar13;
  _func_void_mmt_open_ptr_void_ptr *p_Var14;
  mmt_sync *pmVar15;
  uint uVar16;
  mmt_buf **ppmVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  mmt_memory_dump_v2_prefix *d;
  mmt_buf *b;
  mmt_memory_dump args [20];
  
LAB_002504dc:
  pbVar3 = (byte *)mmt_load_initial_data();
  if (pbVar3 == (byte *)0x0) {
    return;
  }
  bVar1 = *pbVar3;
  switch(bVar1) {
  case 100:
    pmVar4 = (mmt_dup_syscall *)mmt_load_data(10);
    mmt_check_eor(10);
    if (funcs->dup_syscall != (_func_void_mmt_dup_syscall_ptr_void_ptr *)0x0) {
      (*funcs->dup_syscall)(pmVar4,state);
    }
    mmt_idx = mmt_idx + 10;
    goto LAB_002504dc;
  case 0x65:
    pmVar9 = (mmt_mremap *)mmt_load_data(0x3e);
    mmt_check_eor(0x3e);
    if (funcs->mremap != (_func_void_mmt_mremap_ptr_void_ptr *)0x0) {
      (*funcs->mremap)(pmVar9,state);
    }
    mmt_idx = mmt_idx + 0x3e;
    goto LAB_002504dc;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6b:
  case 0x6c:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x76:
switchD_00250503_caseD_66:
    fflush(_stdout);
    fprintf(_stderr,"unknown type: 0x%x\n",(ulong)*pbVar3);
    fprintf(_stderr,"%c\n",(ulong)*pbVar3);
    mmt_dump_next();
    exit(1);
  case 0x69:
    do {
      pvVar8 = mmt_load_data(0xe);
      mmt_buf_check_sanity((mmt_buf *)((long)pvVar8 + 9));
      uVar20 = *(int *)((long)pvVar8 + 9) + 0xe;
      pmVar5 = (mmt_ioctl_post_v2 *)mmt_load_data(uVar20);
      mmt_check_eor(uVar20);
      ppmVar17 = &args[0].data;
      lVar19 = 0;
      uVar16 = uVar20;
      do {
        uVar2 = load_memory_dump_v2(uVar16,&d,&b);
        if (uVar2 == 0) goto LAB_00250651;
        ((mmt_memory_dump *)(ppmVar17 + -2))->addr = d->addr;
        *ppmVar17 = b;
        ppmVar17[-1] = (mmt_buf *)0x0;
        lVar19 = lVar19 + 1;
        uVar16 = uVar16 + uVar2;
        ppmVar17 = ppmVar17 + 3;
      } while (lVar19 != 0x14);
      lVar19 = 0x14;
LAB_00250651:
      iVar18 = (int)lVar19;
      pmVar6 = (mmt_ioctl_post_v2 *)mmt_load_data(uVar20);
    } while (pmVar5 != pmVar6);
    p_Var7 = (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)funcs->ioctl_pre;
    goto LAB_0025066b;
  case 0x6a:
    do {
      pvVar8 = mmt_load_data(0x1e);
      mmt_buf_check_sanity((mmt_buf *)((long)pvVar8 + 0x19));
      uVar20 = *(int *)((long)pvVar8 + 0x19) + 0x1e;
      pmVar5 = (mmt_ioctl_post_v2 *)mmt_load_data(uVar20);
      mmt_check_eor(uVar20);
      ppmVar17 = &args[0].data;
      lVar19 = 0;
      uVar16 = uVar20;
      do {
        uVar2 = load_memory_dump_v2(uVar16,&d,&b);
        if (uVar2 == 0) goto LAB_002505b6;
        ((mmt_memory_dump *)(ppmVar17 + -2))->addr = d->addr;
        *ppmVar17 = b;
        ppmVar17[-1] = (mmt_buf *)0x0;
        lVar19 = lVar19 + 1;
        uVar16 = uVar16 + uVar2;
        ppmVar17 = ppmVar17 + 3;
      } while (lVar19 != 0x14);
      lVar19 = 0x14;
LAB_002505b6:
      iVar18 = (int)lVar19;
      pmVar6 = (mmt_ioctl_post_v2 *)mmt_load_data(uVar20);
    } while (pmVar5 != pmVar6);
    p_Var7 = funcs->ioctl_post;
LAB_0025066b:
    if (p_Var7 != (_func_void_mmt_ioctl_post_v2_ptr_void_ptr_mmt_memory_dump_ptr_int *)0x0) {
      (*p_Var7)(pmVar5,state,args,iVar18);
    }
    mmt_idx = mmt_idx + uVar16;
    goto LAB_002504dc;
  case 0x6d:
    pmVar10 = (mmt_mmap *)mmt_load_data(0x1e);
    mmt_check_eor(0x1e);
    if (funcs->mmap != (_func_void_mmt_mmap_ptr_void_ptr *)0x0) {
      (*funcs->mmap)(pmVar10,state);
    }
    mmt_idx = mmt_idx + 0x1e;
    goto LAB_002504dc;
  case 0x6e:
    mmt_decode_nvidia((mmt_nvidia_decode_funcs *)funcs,state);
    goto LAB_002504dc;
  case 0x6f:
    pvVar8 = mmt_load_data(0x12);
    mmt_buf_check_sanity((mmt_buf *)((long)pvVar8 + 0xd));
    uVar16 = *(int *)((long)pvVar8 + 0xd) + 0x12;
    pmVar13 = (mmt_open *)mmt_load_data(uVar16);
    mmt_check_eor(uVar16);
    p_Var14 = funcs->open;
    break;
  case 0x72:
    pvVar8 = mmt_load_data(0xb);
    uVar16 = *(byte *)((long)pvVar8 + 9) + 0xb;
    pmVar13 = (mmt_open *)mmt_load_data(uVar16);
    mmt_check_eor(uVar16);
    p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memread;
    break;
  case 0x74:
    pvVar8 = mmt_load_data(10);
    mmt_buf_check_sanity((mmt_buf *)((long)pvVar8 + 5));
    uVar16 = *(int *)((long)pvVar8 + 5) + 10;
    pmVar13 = (mmt_open *)mmt_load_data(uVar16);
    mmt_check_eor(uVar16);
    p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->write_syscall;
    break;
  case 0x75:
    pmVar11 = (mmt_unmap *)mmt_load_data(0x2e);
    mmt_check_eor(0x2e);
    if (funcs->munmap != (_func_void_mmt_unmap_ptr_void_ptr *)0x0) {
      (*funcs->munmap)(pmVar11,state);
    }
    mmt_idx = mmt_idx + 0x2e;
    goto LAB_002504dc;
  case 0x77:
    pvVar8 = mmt_load_data(0xb);
    uVar16 = *(byte *)((long)pvVar8 + 9) + 0xb;
    pmVar13 = (mmt_open *)mmt_load_data(uVar16);
    mmt_check_eor(uVar16);
    p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memwrite;
    break;
  default:
    if (bVar1 == 0x2d) {
LAB_002506d1:
      uVar16 = 1;
      while (mmt_buf[(uVar16 + mmt_idx) - 1] != '\n') {
        pvVar8 = mmt_load_data(uVar16);
        uVar16 = uVar16 + 1;
        if (pvVar8 == (void *)0x0) {
          return;
        }
      }
      if (funcs->msg != (_func_void_uint8_t_ptr_uint_void_ptr *)0x0) {
        (*funcs->msg)(mmt_buf + mmt_idx,uVar16 - 1,state);
      }
      mmt_idx = mmt_idx + uVar16;
    }
    else {
      if (bVar1 == 0x57) {
        pvVar8 = mmt_load_data(0xb);
        uVar16 = *(byte *)((long)pvVar8 + 9) + 0xb;
        pmVar13 = (mmt_open *)mmt_load_data(uVar16);
        mmt_check_eor(uVar16);
        p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memwrite2;
        break;
      }
      if (bVar1 == 0x4d) {
        pmVar12 = (mmt_mmap2 *)mmt_load_data(0x2a);
        mmt_check_eor(0x2a);
        if (funcs->mmap2 != (_func_void_mmt_mmap2_ptr_void_ptr *)0x0) {
          (*funcs->mmap2)(pmVar12,state);
        }
        mmt_idx = mmt_idx + 0x2a;
      }
      else {
        if (bVar1 == 0x52) {
          pvVar8 = mmt_load_data(0xb);
          uVar16 = *(byte *)((long)pvVar8 + 9) + 0xb;
          pmVar13 = (mmt_open *)mmt_load_data(uVar16);
          mmt_check_eor(uVar16);
          p_Var14 = (_func_void_mmt_open_ptr_void_ptr *)funcs->memread2;
          break;
        }
        if (bVar1 != 0x53) {
          if (bVar1 != 0x3d) goto switchD_00250503_caseD_66;
          goto LAB_002506d1;
        }
        pmVar15 = (mmt_sync *)mmt_load_data(6);
        mmt_check_eor(6);
        if (funcs->sync != (_func_void_mmt_sync_ptr_void_ptr *)0x0) {
          (*funcs->sync)(pmVar15,state);
        }
        mmt_idx = mmt_idx + 6;
      }
    }
    goto LAB_002504dc;
  }
  if (p_Var14 != (_func_void_mmt_open_ptr_void_ptr *)0x0) {
    (*p_Var14)(pmVar13,state);
  }
  mmt_idx = mmt_idx + uVar16;
  goto LAB_002504dc;
}

Assistant:

void mmt_decode(const struct mmt_decode_funcs *funcs, void *state)
{
	unsigned int size;
	while (1)
	{
		struct mmt_message *msg = mmt_load_initial_data();
		if (msg == NULL)
			return;

		if (msg->type == '=' || msg->type == '-')
		{
			unsigned int len = 0;
			while (mmt_buf[mmt_idx + len] != 10)
				if (mmt_load_data(++len) == NULL)
					return;

			if (funcs->msg)
				funcs->msg(&mmt_buf[mmt_idx], len, state);

			mmt_idx += len + 1;
		}
		else if (msg->type == 'r') // read
		{
			struct mmt_read *w;
			size = sizeof(struct mmt_read) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memread)
				funcs->memread(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'R') // read2
		{
			struct mmt_read2 *w;
			size = sizeof(struct mmt_read2) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memread2)
				funcs->memread2(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'w') // write
		{
			struct mmt_write *w;
			size = sizeof(struct mmt_write) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memwrite)
				funcs->memwrite(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'W') // write2
		{
			struct mmt_write2 *w;
			size = sizeof(struct mmt_write2) + 1;
			w = mmt_load_data(size);
			size += w->len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->memwrite2)
				funcs->memwrite2(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'M') // mmap v2
		{
			size = sizeof(struct mmt_mmap2) + 1;
			struct mmt_mmap2 *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mmap2)
				funcs->mmap2(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'm') // mmap
		{
			size = sizeof(struct mmt_mmap) + 1;
			struct mmt_mmap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mmap)
				funcs->mmap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'u') // unmap
		{
			size = sizeof(struct mmt_unmap) + 1;
			struct mmt_unmap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->munmap)
				funcs->munmap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'e') // mremap
		{
			size = sizeof(struct mmt_mremap) + 1;
			struct mmt_mremap *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->mremap)
				funcs->mremap(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'o') // open
		{
			size = sizeof(struct mmt_open) + 1;
			struct mmt_open *o;
			o = mmt_load_data(size);
			mmt_buf_check_sanity(&o->path);
			size += o->path.len;
			o = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->open)
				funcs->open(o, state);

			mmt_idx += size;
		}
		else if (msg->type == 'n') // nvidia / nouveau
			mmt_decode_nvidia((struct mmt_nvidia_decode_funcs *)funcs, state);
		else if (msg->type == 't') // write syscall
		{
			struct mmt_write_syscall *w;
			size = sizeof(struct mmt_write_syscall) + 1;
			w = mmt_load_data(size);
			mmt_buf_check_sanity(&w->data);
			size += w->data.len;
			w = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->write_syscall)
				funcs->write_syscall(w, state);

			mmt_idx += size;
		}
		else if (msg->type == 'S') // sync
		{
			size = sizeof(struct mmt_sync) + 1;
			struct mmt_sync *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->sync)
				funcs->sync(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'd') // dup syscall
		{
			size = sizeof(struct mmt_dup_syscall) + 1;
			struct mmt_dup_syscall *mm = mmt_load_data(size);

			mmt_check_eor(size);

			if (funcs->dup_syscall)
				funcs->dup_syscall(mm, state);

			mmt_idx += size;
		}
		else if (msg->type == 'i') // ioctl pre
		{
#define MAX_ARGS 20
			unsigned int size2, pfx;
			struct mmt_memory_dump args[MAX_ARGS];
			struct mmt_ioctl_pre_v2 *ctl;
			int argc;

			do
			{
				size = sizeof(struct mmt_ioctl_pre_v2) + 1;
				ctl = mmt_load_data(size);
				mmt_buf_check_sanity(&ctl->data);
				size += ctl->data.len;
				ctl = mmt_load_data(size);

				mmt_check_eor(size);

				argc = 0;

				struct mmt_memory_dump_v2_prefix *d;
				struct mmt_buf *b;
				pfx = size;

				while ((size2 = load_memory_dump_v2(pfx, &d, &b)))
				{
					args[argc].addr = d->addr;
					args[argc].data = b;
					args[argc].str = NULL;
					argc++;
					pfx += size2;
					if (argc == MAX_ARGS)
						break;
				}
			}
			while (ctl != mmt_load_data(size));

			if (funcs->ioctl_pre)
				funcs->ioctl_pre(ctl, state, args, argc);

			mmt_idx += pfx;
		}
		else if (msg->type == 'j')
		{
			unsigned int size2, pfx;
			struct mmt_memory_dump args[MAX_ARGS];
			struct mmt_ioctl_post_v2 *ctl;
			int argc;

			do
			{
				size = sizeof(struct mmt_ioctl_post_v2) + 1;
				ctl = mmt_load_data(size);
				mmt_buf_check_sanity(&ctl->data);
				size += ctl->data.len;
				ctl = mmt_load_data(size);

				mmt_check_eor(size);

				argc = 0;

				struct mmt_memory_dump_v2_prefix *d;
				struct mmt_buf *b;
				pfx = size;

				while ((size2 = load_memory_dump_v2(pfx, &d, &b)))
				{
					args[argc].addr = d->addr;
					args[argc].data = b;
					args[argc].str = NULL;
					argc++;
					pfx += size2;
					if (argc == MAX_ARGS)
						break;
				}
			}
			while (ctl != mmt_load_data(size));

			if (funcs->ioctl_post)
				funcs->ioctl_post(ctl, state, args, argc);

			mmt_idx += pfx;
#undef MAX_ARGS
		}
		else
		{
			fflush(stdout);
			fprintf(stderr, "unknown type: 0x%x\n", msg->type);
			fprintf(stderr, "%c\n", msg->type);
			mmt_dump_next();
			exit(1);
		}
	}
}